

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int entity2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  
  if (tok == 0xf) {
    return 0;
  }
  if (tok == 0x1b) {
    iVar3 = 10;
    pcVar2 = declClose;
    goto LAB_0015f775;
  }
  if (tok == 0x12) {
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"SYSTEM");
    iVar3 = 0;
    if (iVar1 != 0) {
      pcVar2 = entity4;
      iVar3 = 0;
      goto LAB_0015f775;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"PUBLIC");
    if (iVar1 != 0) {
      pcVar2 = entity3;
      goto LAB_0015f775;
    }
  }
  else if ((tok == 0x1c) && (state->documentEntity == 0)) {
    return 0x34;
  }
  iVar3 = -1;
  pcVar2 = error;
LAB_0015f775:
  state->handler = pcVar2;
  return iVar3;
}

Assistant:

static
int entity2(PROLOG_STATE *state,
            int tok,
            const char *ptr,
            const char *end,
            const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_NAME:
    if (XmlNameMatchesAscii(enc, ptr, end, KW_SYSTEM)) {
      state->handler = entity4;
      return XML_ROLE_NONE;
    }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_PUBLIC)) {
      state->handler = entity3;
      return XML_ROLE_NONE;
    }
    break;
  case XML_TOK_LITERAL:
    state->handler = declClose;
    return XML_ROLE_ENTITY_VALUE;
  }
  return common(state, tok);
}